

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O2

boolean test_move(int ux,int uy,int dx,int dy,int dz,int mode)

{
  level *plVar1;
  boolean bVar2;
  char cVar3;
  byte bVar4;
  schar sVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  trap *ptVar10;
  obj *poVar11;
  ulong uVar12;
  obj *poVar13;
  char *pcVar14;
  char *pcVar15;
  char oy;
  undefined4 in_register_0000000c;
  ulong uVar16;
  undefined4 in_register_00000014;
  xchar y;
  byte bVar17;
  int iVar18;
  xchar x;
  int iVar19;
  char *pcVar20;
  byte x_00;
  monst *worm;
  uint uVar21;
  bool bVar22;
  bool bVar23;
  xchar local_c0;
  xchar local_b8;
  d_level local_aa;
  long local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  long local_90;
  long local_88;
  char *local_80;
  ulong local_78;
  d_level *local_70;
  int local_68;
  int local_64;
  trap *local_60;
  char *local_58;
  char *local_50;
  d_level *local_48;
  d_level *local_40;
  long local_38;
  
  plVar1 = level;
  local_a0 = CONCAT44(in_register_00000014,dx);
  local_98 = CONCAT44(in_register_0000000c,dy);
  iVar19 = dx + ux;
  iVar18 = dy + uy;
  lVar9 = (long)iVar19;
  local_a8 = lVar9 * 0xfc;
  cVar3 = level->locations[lVar9][iVar18].typ;
  y = (xchar)iVar18;
  x = (xchar)iVar19;
  if ('\x10' < cVar3 && cVar3 != '\x16') {
    if (cVar3 != '\x17') goto LAB_0019cab7;
    bVar2 = closed_door(level,iVar19,iVar18);
    if (bVar2 != '\0') {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0019c5e6;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0019c5dd;
      }
      else {
LAB_0019c5dd:
        if (ublindf == (obj *)0x0) {
          if (mode != 0) goto LAB_0019c883;
        }
        else {
LAB_0019c5e6:
          if ((mode != 0) || (ublindf->oartifact == '\x1d')) goto LAB_0019c883;
        }
        feel_location(x,y);
      }
LAB_0019c883:
      iVar6 = artifact_door(level,iVar19,iVar18);
      if (iVar6 != 0) {
        if (mode != 0) {
          return '\0';
        }
        uVar8 = (youmonst.data)->mflags1;
        if ((uVar8 & 4) != 0) {
          pcVar20 = "You try to ooze under the door, but the gap is too small.";
          goto LAB_0019cb8e;
        }
        if ((uVar8 & 0x60) == 0x20) {
          pcVar20 = "You hurt your teeth on the reinforced door.";
          goto LAB_0019cb8e;
        }
        if ((int)local_a0 != 0 && (int)local_98 != 0) {
          return '\0';
        }
        if (u.uprops[0x1e].intrinsic == 0) {
          if (ublindf == (obj *)0x0) {
            if ((uVar8 & 0x1000) == 0 && u.uprops[0x1b].intrinsic == 0) goto LAB_0019dc04;
          }
          else {
            if (((uVar8 >> 0xc & 1) != 0) || (ublindf->otyp != 0xed)) goto LAB_0019c9b2;
LAB_0019dbf0:
            if (u.uprops[0x1b].intrinsic == 0) {
LAB_0019dc04:
              if ((((u.umonnum != 0x9e) && ((youmonst.data)->mlet != '\x1c')) &&
                  (sVar5 = acurr(3), '\t' < sVar5)) &&
                 ((u.uprops[0x25].intrinsic == 0 && (u.uprops[0x25].extrinsic == 0)))) {
LAB_0019dc5d:
                pcVar20 = "That door is closed.";
                goto LAB_0019cb8e;
              }
            }
          }
        }
        else if (ublindf != (obj *)0x0) {
LAB_0019c9b2:
          if (ublindf->oartifact == '\x1d') goto LAB_0019dbf0;
        }
        pcVar20 = "Ouch!  You bump into a heavy door.";
LAB_0019df55:
        pline(pcVar20);
        exercise(3,'\0');
        return '\0';
      }
      if ((u.uprops[0x3e].extrinsic == 0 && u.uprops[0x3e].intrinsic == 0) &&
         (((youmonst.data)->mflags1 & 8) == 0)) {
        bVar2 = can_ooze(&youmonst);
        if (bVar2 == '\0') {
          uVar8 = (youmonst.data)->mflags1;
          if ((uVar8 & 0x60) != 0x20) {
            if (mode != 0) {
              if ((mode & 0xfffffffeU) != 2) {
                return '\0';
              }
              goto LAB_0019c9f9;
            }
            if ((uVar8 & 4) != 0) {
              pcVar20 = 
              "You try to ooze under the door, but can\'t squeeze your possessions through.";
              goto LAB_0019cb8e;
            }
            if ((int)local_a0 != 0 && (int)local_98 != 0) {
              return '\0';
            }
            if (u.uprops[0x1e].intrinsic == 0) {
              if (ublindf == (obj *)0x0) {
                if ((uVar8 & 0x1000) == 0 && u.uprops[0x1b].intrinsic == 0) goto LAB_0019e049;
              }
              else {
                if (((uVar8 >> 0xc & 1) != 0) || (ublindf->otyp != 0xed)) goto LAB_0019de99;
LAB_0019e035:
                if (u.uprops[0x1b].intrinsic == 0) {
LAB_0019e049:
                  if ((((u.umonnum != 0x9e) && ((youmonst.data)->mlet != '\x1c')) &&
                      (sVar5 = acurr(3), '\t' < sVar5)) &&
                     ((u.uprops[0x25].intrinsic == 0 && (u.uprops[0x25].extrinsic == 0))))
                  goto LAB_0019dc5d;
                }
              }
            }
            else if (ublindf != (obj *)0x0) {
LAB_0019de99:
              if (ublindf->oartifact == '\x1d') goto LAB_0019e035;
            }
            if (u.usteed != (monst *)0x0) {
              pcVar20 = y_monnam(u.usteed);
              pcVar14 = "You can\'t lead %s through that closed door.";
LAB_0019dab0:
              pline(pcVar14,pcVar20);
              return '\0';
            }
            pcVar20 = "Ouch!  You bump into a door.";
            goto LAB_0019df55;
          }
          if (mode != 0) goto LAB_0019cab7;
          goto LAB_0019c701;
        }
        if (mode == 0) {
          pline("You ooze under the door.");
        }
      }
      goto LAB_0019cab7;
    }
LAB_0019c9f9:
    if (((((int)local_a0 == 0) || ((int)local_98 == 0)) ||
        ((u.uprops[0x3e].intrinsic != 0 ||
         ((u.uprops[0x3e].extrinsic != 0 || (((youmonst.data)->mflags1 & 8) != 0)))))) ||
       (((*(ushort *)&plVar1->locations[lVar9][iVar18].field_0x6 & 0x1e0) == 0 &&
        ((bVar2 = on_level(&u.uz,&dungeon_topology.d_rogue_level), bVar2 == '\0' &&
         (bVar2 = block_door(x,y), bVar2 == '\0')))))) goto LAB_0019cab7;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
        if (((youmonst.data)->mflags1 & 0x1000) == 0) {
          return '\0';
        }
        goto LAB_0019ca95;
      }
    }
    else {
LAB_0019ca95:
      if (ublindf == (obj *)0x0) {
        if (mode != 0) {
          return '\0';
        }
        goto LAB_0019cd3e;
      }
    }
    if (mode != 0) {
      return '\0';
    }
    if (ublindf->oartifact == '\x1d') {
      return '\0';
    }
LAB_0019cd3e:
    feel_location(x,y);
    return '\0';
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0019c588;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0019c57f;
  }
  else {
LAB_0019c57f:
    if (ublindf == (obj *)0x0) {
      if (mode != 0) goto LAB_0019c639;
    }
    else {
LAB_0019c588:
      if ((mode != 0) || (ublindf->oartifact == '\x1d')) goto LAB_0019c639;
    }
    feel_location(x,y);
  }
LAB_0019c639:
  uVar21 = u.uprops[0x3e].intrinsic;
  uVar8 = u.uprops[0x3e].extrinsic;
  if (((u.uprops[0x3e].intrinsic == 0 && u.uprops[0x3e].extrinsic == 0) &&
      (((youmonst.data)->mflags1 & 8) == 0)) || (bVar2 = may_passwall(level,x,y), bVar2 == '\0')) {
    if (plVar1->locations[lVar9][iVar18].typ == '\x16') {
      if ((((mode == 0) && (flags.nopick == '\0')) && ((int)(youmonst.data)->mflags1 < 0)) &&
         (iVar6 = still_chewing(x,y), uVar8 = u.uprops[0x3e].extrinsic,
         uVar21 = u.uprops[0x3e].intrinsic, iVar6 != 0)) {
        return '\0';
      }
      if (((uVar8 == 0 && uVar21 == 0) && (((youmonst.data)->mflags1 & 8) == 0)) &&
         (bVar2 = passes_bars(youmonst.data), bVar2 == '\0')) {
        return '\0';
      }
    }
    else {
      if (((youmonst.data)->mflags1 & 0x60) != 0x20) {
        if ((((uwep != (obj *)0x0 && flags.autodig != '\0') &&
              (flags.nopick == '\0' && flags.run == 0)) && ((byte)(uwep->oclass | 4U) == 6)) &&
           (objects[uwep->otyp].oc_subtyp == '\x04')) {
          if (mode != 0) {
            return '\0';
          }
          use_pick_axe2(uwep,(schar)local_a0,(schar)local_98,(schar)dz);
          return '\0';
        }
        if (mode != 0) {
          return '\0';
        }
        bVar2 = on_level(&u.uz,&dungeon_topology.d_stronghold_level);
        if ((bVar2 != '\0') && (bVar2 = is_db_wall(iVar19,iVar18), bVar2 != '\0')) {
          pline("The drawbridge is up!");
        }
        if ((u.uprops[0x3e].extrinsic == 0 && u.uprops[0x3e].intrinsic == 0) &&
           (((youmonst.data)->mflags1 & 8) == 0)) {
          return '\0';
        }
        bVar2 = may_passwall(level,x,y);
        if (bVar2 != '\0') {
          return '\0';
        }
        if (u.uz.dnum != dungeon_topology.d_sokoban_dnum) {
          return '\0';
        }
        pcVar20 = "The Sokoban walls resist your ability.";
        goto LAB_0019cb8e;
      }
      if (mode == 0) {
LAB_0019c701:
        iVar6 = still_chewing(x,y);
        if (iVar6 != 0) {
          return '\0';
        }
      }
    }
  }
LAB_0019cab7:
  bVar22 = (int)local_a0 != 0;
  bVar23 = (int)local_98 != 0;
  if (bVar23 && bVar22) {
    local_c0 = (xchar)ux;
    bVar2 = bad_rock(youmonst.data,'\x01',local_c0,y);
    if (bVar2 != '\0') {
      local_b8 = (xchar)uy;
      bVar2 = bad_rock(youmonst.data,'\x01',x,local_b8);
      if (bVar2 != '\0') {
        if (u.uz.dnum == dungeon_topology.d_sokoban_dnum) {
          if (mode != 0) {
            return '\0';
          }
          pcVar20 = "You cannot pass that way.";
LAB_0019cb8e:
          pline(pcVar20);
          return '\0';
        }
        if (2 < (youmonst.data)->msize) {
          if (mode != 0) {
            return '\0';
          }
          pcVar20 = "Your body is too large to fit through.";
          goto LAB_0019cb8e;
        }
        if (invent != (obj *)0x0) {
          iVar6 = inv_weight();
          iVar7 = weight_cap();
          if (600 < iVar7 + iVar6) {
            if (mode != 0) {
              return '\0';
            }
            pcVar20 = "You are carrying too much to get through.";
            goto LAB_0019cb8e;
          }
        }
      }
    }
  }
  if ((flags.run == 8) && ((iVar19 != u.ux || (iVar18 != u.uy)))) {
    ptVar10 = t_at(level,iVar19,iVar18);
    if ((ptVar10 != (trap *)0x0) && ((ptVar10->field_0x8 & 0x20) != 0)) {
LAB_0019cdc2:
      if (mode != 0) goto LAB_0019cdc7;
      bVar2 = is_pool(level,iVar19,iVar18);
      if (bVar2 == '\0') {
        bVar2 = is_lava(level,iVar19,iVar18);
        if (bVar2 != '\0') {
          pcVar20 = "a pool of lava";
          goto LAB_0019ce2e;
        }
        bVar2 = is_swamp(level,iVar19,iVar18);
        if (bVar2 != '\0') {
          pcVar20 = "a muddy swamp";
          goto LAB_0019ce2e;
        }
      }
      else {
        pcVar20 = "a body of water";
LAB_0019ce2e:
        autoexplore_msg(pcVar20);
      }
      if (flags.travel != '\0') {
        return '\0';
      }
LAB_0019cdc7:
      return mode == 3 || mode == 0;
    }
    if ((((u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) &&
         ((youmonst.data)->mlet != '\x05')) && (u.uprops[0x3c].extrinsic == 0)) &&
       (uVar8 = (youmonst.data)->mflags1, (uVar8 & 1) == 0)) {
      if (u.usteed == (monst *)0x0) {
        if ((uVar8 & 0x10) == 0) goto LAB_0019cd57;
      }
      else if ((uVar8 & 0x10) == 0 && ((u.usteed)->data->mflags1 & 1) == 0) {
LAB_0019cd57:
        bVar2 = is_pool(level,iVar19,iVar18);
        if ((((bVar2 != '\0') || (bVar2 = is_lava(level,iVar19,iVar18), bVar2 != '\0')) ||
            (bVar2 = is_swamp(level,iVar19,iVar18), bVar2 != '\0')) &&
           ((&level->locations[0][iVar18].seenv)[local_a8] != '\0')) goto LAB_0019cdc2;
      }
    }
  }
  if (mode == 3) {
    return '\0';
  }
  if ((((bVar23 && bVar22) && u.uprops[0x3e].intrinsic == 0) && (u.uprops[0x3e].extrinsic == 0)) &&
     (((youmonst.data)->mflags1 & 8) == 0)) {
    if ((level->locations[ux][uy].typ == '\x17') &&
       ((((*(ushort *)&level->locations[ux][uy].field_0x6 & 0x1e0) != 0 ||
         (bVar2 = on_level(&u.uz,&dungeon_topology.d_rogue_level), bVar2 != '\0')) ||
        (bVar2 = block_entry(x,y), bVar2 != '\0')))) {
      if (mode != 0) {
        return '\0';
      }
      pcVar20 = "the doorway";
      goto LAB_0019cf5d;
    }
  }
  poVar11 = sobj_at(0x214,level,iVar19,iVar18);
  if (poVar11 == (obj *)0x0) {
    return '\x01';
  }
  if (u.uz.dnum != dungeon_topology.d_sokoban_dnum) {
    if (u.uprops[0x3e].extrinsic != 0 || u.uprops[0x3e].intrinsic != 0) {
      return '\x01';
    }
    if (((youmonst.data)->mflags1 & 8) != 0) {
      return '\x01';
    }
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0019ce89;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0019ce80;
LAB_0019cedc:
    if ((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) {
      if (mode != 2) goto LAB_0019cf27;
    }
    else if (((u.umonnum != u.umonster) && (bVar2 = dmgtype(youmonst.data,0x24), mode != 2)) &&
            (bVar2 != '\0')) {
LAB_0019cf27:
      if (1 < flags.run) {
        poVar11 = sobj_at(0x214,level,iVar19,iVar18);
        if (mode != 0) {
          return '\0';
        }
        if (poVar11 == (obj *)0x0) {
          return '\0';
        }
        pcVar20 = "a boulder";
LAB_0019cf5d:
        autoexplore_msg(pcVar20);
        return '\0';
      }
    }
  }
  else {
LAB_0019ce80:
    if (ublindf != (obj *)0x0) {
LAB_0019ce89:
      if (ublindf->oartifact == '\x1d') goto LAB_0019cedc;
    }
  }
  if (mode == 2) {
    if (u.uz.dnum == dungeon_topology.d_sokoban_dnum) {
      return '\0';
    }
    poVar11 = sobj_at(0x214,level,ux,uy);
    if (poVar11 == (obj *)0x0) {
      return '\x01';
    }
    if (u.uz.dnum == dungeon_topology.d_sokoban_dnum) {
      return '\x01';
    }
    if (u.uprops[0x3e].extrinsic != 0 || u.uprops[0x3e].intrinsic != 0) {
      return '\x01';
    }
    if (((youmonst.data)->mflags1 & 0x60) == 0x20 ||
        (char)(((youmonst.data)->mflags1 & 8) >> 3) != '\0') {
      return '\x01';
    }
    poVar11 = carrying(0x108);
    if (poVar11 != (obj *)0x0) {
      return '\x01';
    }
    poVar11 = carrying(0x33);
    if (poVar11 != (obj *)0x0) {
      return '\x01';
    }
    poVar11 = carrying(0x1cf);
    if (poVar11 == (obj *)0x0) {
      return '\0';
    }
    if ((objects[poVar11->otyp].field_0x10 & 1) != 0) {
      return '\0';
    }
    return '\x01';
  }
  if (mode != 0) {
    return '\x01';
  }
  if ((((youmonst.data)->mflags1 & 0x60) == 0x20) && (u.uz.dnum != dungeon_topology.d_sokoban_dnum))
  {
    iVar18 = still_chewing(x,y);
    if (iVar18 == 0) {
      return '\x01';
    }
    return '\0';
  }
  cVar3 = u.ux + (char)local_a0;
  oy = u.uy + (char)local_98;
  iVar18 = (int)oy;
  local_a8 = CONCAT44(local_a8._4_4_,(int)cVar3);
  local_88 = (long)cVar3;
  local_90 = (long)oy;
  local_64 = (int)local_a0 * 2;
  local_68 = (int)local_98 * 2;
  local_38 = local_88 * 0xa8;
  local_70 = &u.uz;
  local_40 = &dungeon_topology.d_air_level;
  local_48 = &dungeon_topology.d_rogue_level;
LAB_0019d015:
  poVar11 = sobj_at(0x214,level,(int)local_a8,iVar18);
  if (poVar11 == (obj *)0x0) {
    return '\x01';
  }
  if (poVar11 != *(obj **)((long)level->objects[0] + local_90 * 8 + local_38)) {
    movobj(poVar11,(xchar)local_a8,oy);
  }
  x_00 = u.ux + (char)local_64;
  bVar17 = u.uy + (char)local_68;
  nomul(0,(char *)0x0);
  if (((u.uprops[0x12].extrinsic != 0 || u.uprops[0x12].intrinsic != 0) ||
      ((youmonst.data)->mlet == '\x05')) || (bVar2 = on_level(local_70,local_40), bVar2 != '\0')) {
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0019da84;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0019da7f;
    }
    else {
LAB_0019da7f:
      if (ublindf != (obj *)0x0) {
LAB_0019da84:
        if (ublindf->oartifact == '\x1d') goto LAB_0019da99;
      }
      feel_location((xchar)local_88,(xchar)local_90);
    }
LAB_0019da99:
    pcVar20 = xname(poVar11);
    pcVar20 = the(pcVar20);
    pcVar14 = "You don\'t have enough leverage to push %s.";
    goto LAB_0019dab0;
  }
  if (((youmonst.data)->msize == '\0') && (u.usteed == (monst *)0x0)) {
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0019db99;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0019db94;
    }
    else {
LAB_0019db94:
      if (ublindf != (obj *)0x0) {
LAB_0019db99:
        if (ublindf->oartifact == '\x1d') goto LAB_0019dbac;
      }
      feel_location((xchar)local_a8,oy);
    }
LAB_0019dbac:
    pcVar20 = xname(poVar11);
    pline("You\'re too small to push that %s.",pcVar20);
LAB_0019dcee:
    if (((youmonst.data)->mflags2 & 0x8000000) != 0) {
      if ((u.usteed != (monst *)0x0) && (u.weapon_skills[0x27].skill < '\x02')) {
        pcVar20 = "push aside";
        if (u.uz.dnum != dungeon_topology.d_sokoban_dnum && flags.pickup != '\0') {
          pcVar20 = "pick up";
        }
        pcVar14 = xname(poVar11);
        pcVar14 = the(pcVar14);
        pcVar15 = y_monnam(u.usteed);
        pline("You aren\'t skilled enough to %s %s from %s.",pcVar20,pcVar14,pcVar15);
        return '\x01';
      }
      pcVar20 = "push it aside";
      if (u.uz.dnum != dungeon_topology.d_sokoban_dnum && flags.pickup != '\0') {
        pcVar20 = "pick it up";
      }
      pline("However, you can easily %s.",pcVar20);
      goto LAB_0019de31;
    }
    if (u.usteed != (monst *)0x0) {
      return '\0';
    }
    if ((invent == (obj *)0x0) || (iVar18 = inv_weight(), iVar18 < -0x351)) {
      if (((schar)local_a0 != '\0' && (schar)local_98 != '\0') &&
         (('\x10' < level->locations[u.ux][local_90].typ ||
          ('\x10' < level->locations[local_88][u.uy].typ)))) goto LAB_0019dd7d;
    }
    else {
LAB_0019dd7d:
      if ((youmonst.data)->msize != '\0') {
        return '\0';
      }
    }
    pline("However, you can squeeze yourself into a small opening.");
LAB_0019de31:
    if (u.uz.dnum != dungeon_topology.d_sokoban_dnum) {
      return '\x01';
    }
    sokoban_trickster();
    return '\x01';
  }
  if ((0x4e < (byte)(x_00 - 1)) || (0x14 < bVar17)) {
LAB_0019d9f8:
    if (u.usteed == (monst *)0x0) {
      pcVar20 = xname(poVar11);
      pcVar20 = the(pcVar20);
      pline("You try to move %s, but in vain.",pcVar20);
    }
    else {
      pcVar20 = y_monnam(u.usteed);
      pcVar20 = upstart(pcVar20);
      pcVar14 = xname(poVar11);
      pcVar14 = the(pcVar14);
      pline("%s tries to move %s, but cannot.",pcVar20,pcVar14);
    }
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
        if (((youmonst.data)->mflags1 & 0x1000) == 0) goto LAB_0019dcee;
        goto LAB_0019db17;
      }
LAB_0019db1c:
      if (ublindf->oartifact == '\x1d') goto LAB_0019dcee;
    }
    else {
LAB_0019db17:
      if (ublindf != (obj *)0x0) goto LAB_0019db1c;
    }
    feel_location((xchar)local_88,(xchar)local_90);
    goto LAB_0019dcee;
  }
  uVar12 = (ulong)x_00;
  lVar9 = uVar12 * 0xfc;
  uVar16 = (ulong)bVar17;
  local_80 = (char *)(uVar16 * 0xc);
  cVar3 = local_80[(long)(level->levname + lVar9 + 0x44)];
  if (((cVar3 < '\x11') || (cVar3 == '\x16')) ||
     (((((schar)local_98 != '\0' && ((schar)local_a0 != '\0')) && (cVar3 == '\x17')) &&
      ((bVar2 = on_level(local_70,local_48), bVar2 != '\0' ||
       ((*(ushort *)(local_80 + (long)(level->levname + lVar9 + 0x46)) & 0x1e0) != 0))))))
  goto LAB_0019d9f8;
  iVar19 = (int)(char)x_00;
  iVar6 = (int)(char)bVar17;
  poVar13 = sobj_at(0x214,level,iVar19,iVar6);
  if (poVar13 != (obj *)0x0) goto LAB_0019d9f8;
  ptVar10 = t_at(level,iVar19,iVar6);
  worm = level->monsters[uVar12][uVar16];
  if (worm == (monst *)0x0) {
    worm = (monst *)0x0;
  }
  else if ((worm->field_0x61 & 2) != 0) {
    worm = (monst *)0x0;
  }
  local_60 = ptVar10;
  if ((((schar)local_98 != '\0') && ((schar)local_a0 != '\0')) &&
     (u.uz.dnum == dungeon_topology.d_sokoban_dnum)) {
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0019dc94;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0019dc8f;
    }
    else {
LAB_0019dc8f:
      if (ublindf != (obj *)0x0) {
LAB_0019dc94:
        if (ublindf->oartifact == '\x1d') goto LAB_0019dca7;
      }
      feel_location((xchar)local_a8,oy);
    }
LAB_0019dca7:
    pcVar20 = xname(poVar11);
    pcVar20 = The(pcVar20);
    pcVar14 = surface((int)local_a8,iVar18);
    pline("%s won\'t roll diagonally on this %s.",pcVar20,pcVar14);
    goto LAB_0019dcee;
  }
  bVar2 = revive_nasty(iVar19,iVar6,"You sense movement on the other side.");
  if (bVar2 != '\0') {
    return '\0';
  }
  if ((worm != (monst *)0x0) && (worm->data->mlet != '6')) {
    if (((worm->field_0x62 & 0x80) != 0) &&
       ((ptVar10 != (trap *)0x0 && (bVar4 = ptVar10->field_0x8, (byte)((bVar4 & 0x1f) - 0xb) < 2))))
    goto LAB_0019d27e;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0019ded3;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0019dece;
    }
    else {
LAB_0019dece:
      if (ublindf != (obj *)0x0) {
LAB_0019ded3:
        if (ublindf->oartifact == '\x1d') goto LAB_0019dee6;
      }
      feel_location((xchar)local_a8,oy);
    }
LAB_0019dee6:
    if (worm->wormno == '\0') {
      if ((viz_array[worm->my][worm->mx] & 2U) != 0) goto LAB_0019e0f5;
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0019e007;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0019dffe;
      }
      else {
LAB_0019dffe:
        if (ublindf == (obj *)0x0) goto LAB_0019e13c;
LAB_0019e007:
        if (ublindf->oartifact != '\x1d') goto LAB_0019e13c;
      }
      if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
           (((youmonst.data)->mflags3 & 0x100) != 0)) && ((viz_array[worm->my][worm->mx] & 1U) != 0)
          ) && ((worm->data->mflags3 & 0x200) != 0)) goto LAB_0019e0f5;
LAB_0019e13c:
      if (((worm->data->mflags1 & 0x10000) == 0) &&
         ((poVar13 = which_armor(worm,4), poVar13 == (obj *)0x0 ||
          (poVar13 = which_armor(worm,4), poVar13->otyp != 0x4f)))) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0019e189;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0019e184;
        }
        else {
LAB_0019e184:
          if (ublindf != (obj *)0x0) {
LAB_0019e189:
            if (ublindf->oartifact == '\x1d') goto LAB_0019e204;
          }
          if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
               (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
               youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_0019e256;
        }
LAB_0019e204:
        if ((u.uprops[0x19].extrinsic != 0) &&
           ((u.uprops[0x19].blocked == 0 &&
            (iVar18 = dist2((int)worm->mx,(int)worm->my,(int)u.ux,(int)u.uy), iVar18 < 0x41))))
        goto LAB_0019e256;
      }
      if ((u.uprops[0x42].intrinsic != 0) ||
         ((u.uprops[0x42].extrinsic != 0 || (bVar2 = match_warn_of_mon(worm), bVar2 != '\0'))))
      goto LAB_0019e256;
      pcVar20 = xname(poVar11);
      pcVar20 = the(pcVar20);
      You_hear("a monster behind %s.",pcVar20);
      map_invisible(x_00,bVar17);
    }
    else {
      bVar2 = worm_known(level,worm);
      if (bVar2 == '\0') goto LAB_0019e13c;
LAB_0019e0f5:
      uVar8 = *(uint *)&worm->field_0x60;
      if ((((uVar8 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0))
      {
        if (((uVar8 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
        goto LAB_0019e12e;
        goto LAB_0019e13c;
      }
      if ((uVar8 & 0x280) != 0) goto LAB_0019e13c;
LAB_0019e12e:
      if ((u._1052_1_ & 0x20) != 0) goto LAB_0019e13c;
LAB_0019e256:
      pcVar20 = a_monnam(worm);
      pline("There\'s %s on the other side.",pcVar20);
    }
    if (flags.verbose != '\0') {
      if (u.usteed == (monst *)0x0) {
        pcVar20 = "you";
      }
      else {
        pcVar20 = y_monnam(u.usteed);
      }
      pline("Perhaps that\'s why %s cannot move it.",pcVar20);
    }
    goto LAB_0019dcee;
  }
  if (ptVar10 == (trap *)0x0) {
switchD_0019d29d_caseD_7:
    bVar2 = closed_door(level,iVar19,iVar6);
    if (bVar2 != '\0') goto LAB_0019d9f8;
    bVar2 = boulder_hits_pool(poVar11,iVar19,iVar6,'\x01');
    if (bVar2 == '\0') {
      if (poVar11 != level->objlist) {
        remove_object(poVar11);
        place_object(poVar11,level,(int)poVar11->ox,(int)poVar11->oy);
      }
      if (u.usteed == (monst *)0x0) {
        if ((long)(ulong)moves < (long)moverock_lastmovetime ||
            (long)(moverock_lastmovetime + 2) < (long)(ulong)moves) {
          pcVar20 = "little";
          if (((youmonst.data)->mflags2 >> 0x1b & 1) == 0) {
            pcVar20 = "great";
          }
          pcVar14 = xname(poVar11);
          pcVar14 = the(pcVar14);
          pline("With %s effort you move %s.",pcVar20,pcVar14);
        }
        exercise(0,'\x01');
      }
      else {
        pcVar20 = y_monnam(u.usteed);
        pcVar20 = upstart(pcVar20);
        pcVar14 = xname(poVar11);
        pcVar14 = the(pcVar14);
        pline("%s moves %s.",pcVar20,pcVar14);
      }
      moverock_lastmovetime = (ulong)moves;
      if ((local_80[(long)(level->levname + lVar9 + 0x46)] & 8U) != 0) {
        unmap_object(iVar19,iVar6);
      }
      movobj(poVar11,x_00,bVar17);
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0019d8a8;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0019d8a3;
LAB_0019d8ea:
        newsym((int)local_a8,iVar18);
      }
      else {
LAB_0019d8a3:
        if (ublindf != (obj *)0x0) {
LAB_0019d8a8:
          if (ublindf->oartifact == '\x1d') goto LAB_0019d8ea;
        }
        feel_location(x_00,bVar17);
        feel_location((xchar)local_88,(xchar)local_90);
      }
    }
    goto LAB_0019d015;
  }
  bVar4 = ptVar10->field_0x8;
LAB_0019d27e:
  switch(bVar4 & 0x1f) {
  case 6:
    uVar8 = mt_random();
    if (uVar8 % 10 == 0) goto switchD_0019d29d_caseD_7;
    obj_extract_self(poVar11);
    place_object(poVar11,level,iVar19,iVar6);
    iVar7 = (int)local_a8;
    local_78 = uVar12;
    unblock_point((int)local_a8,iVar18);
    newsym(iVar7,iVar18);
    pcVar20 = Tobjnam(poVar11,"trigger");
    pcVar14 = "your";
    if (-1 < (char)ptVar10->field_0x8) {
      pcVar14 = "a";
    }
    pline("KAABLAMM!!!  %s %s land mine.",pcVar20,pcVar14);
    blow_up_landmine(ptVar10);
    fill_pit(level,(int)u.ux,(int)u.uy);
    bVar17 = viz_array[uVar16][local_78];
    break;
  default:
    goto switchD_0019d29d_caseD_7;
  case 0xb:
  case 0xc:
    obj_extract_self(poVar11);
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0019d2d3;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0019d2ca;
LAB_0019d566:
      viz_array[uVar16][uVar12] = viz_array[uVar16][uVar12] | 2;
    }
    else {
LAB_0019d2ca:
      if (ublindf != (obj *)0x0) {
LAB_0019d2d3:
        if (ublindf->oartifact == '\x1d') goto LAB_0019d566;
      }
    }
    bVar2 = flooreffects(poVar11,iVar19,iVar6,"fall");
    if (bVar2 == '\0') {
      place_object(poVar11,level,iVar19,iVar6);
    }
    if (worm == (monst *)0x0) goto LAB_0019d015;
    if (u.uprops[0x1e].intrinsic != 0) {
LAB_0019d5d6:
      if (ublindf != (obj *)0x0) {
LAB_0019d5df:
        if (ublindf->oartifact == '\x1d') goto LAB_0019d7c5;
      }
      goto LAB_0019d015;
    }
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0019d5df;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0019d5d6;
    goto LAB_0019d7c5;
  case 0xd:
  case 0xe:
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0019d35f;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0019d35a;
LAB_0019d6c4:
      pcVar20 = "fall";
      if ((bVar4 & 0x1f) == 0xe) {
        pcVar20 = "trigger";
      }
      local_78 = uVar12;
      local_80 = Tobjnam(poVar11,pcVar20);
      local_50 = " into";
      if ((ptVar10->field_0x8 & 0x1f) == 0xe) {
        local_50 = "";
      }
      local_58 = otense(poVar11,"plug");
      pcVar20 = "plugs a hole";
      if ((ptVar10->field_0x8 & 0x1f) == 0xe) {
        pcVar20 = "plugs a trap door";
      }
      pcVar14 = surface(iVar19,iVar6);
      pline("%s%s and %s a %s in the %s!",local_80,local_50,local_58,pcVar20 + 8,pcVar14);
    }
    else {
LAB_0019d35a:
      if (ublindf != (obj *)0x0) {
LAB_0019d35f:
        if (ublindf->oartifact == '\x1d') goto LAB_0019d6c4;
      }
      local_78 = uVar12;
      pcVar20 = xname(poVar11);
      pcVar20 = the(pcVar20);
      pline("Kerplunk!  You no longer feel %s.",pcVar20);
    }
    deltrap(level,ptVar10);
    delobj(poVar11);
    bury_objs(iVar19,iVar6);
    bVar17 = viz_array[uVar16][local_78];
    break;
  case 0x10:
  case 0x11:
    if (u.usteed == (monst *)0x0) {
      pcVar20 = xname(poVar11);
      pcVar20 = the(pcVar20);
      pline("You push %s and suddenly it disappears!",pcVar20);
    }
    else {
      pcVar20 = y_monnam(u.usteed);
      pcVar20 = upstart(pcVar20);
      pcVar14 = xname(poVar11);
      pcVar14 = the(pcVar14);
      pline("%s pushes %s and suddenly it disappears!",pcVar20,pcVar14);
    }
    if ((ptVar10->field_0x8 & 0x1f) != 0x10) goto LAB_0019d640;
    rloco(poVar11);
    goto LAB_0019d633;
  }
  if ((bVar17 & 2) == 0) goto LAB_0019d015;
LAB_0019d7c5:
  newsym(iVar19,iVar6);
  goto LAB_0019d015;
LAB_0019d640:
  iVar19 = random_teleport_level();
  sVar5 = depth(local_70);
  if ((iVar19 != sVar5) && (u.uz.dnum != dungeon_topology.d_astral_level.dnum)) {
    obj_extract_self(poVar11);
    get_level(&local_aa,iVar19);
    deliver_object(poVar11,local_aa.dnum,local_aa.dlevel,0);
    ptVar10 = local_60;
LAB_0019d633:
    seetrap(ptVar10);
  }
  goto LAB_0019d015;
}

Assistant:

boolean test_move(int ux, int uy, int dx, int dy, int dz, int mode)
{
    int x = ux+dx;
    int y = uy+dy;
    struct rm *tmpr = &level->locations[x][y];
    struct rm *ust;

    /*
     *  Check for physical obstacles.  First, the place we are going.
     */
    if (IS_ROCK(tmpr->typ) || tmpr->typ == IRONBARS) {
	if (Blind && mode == DO_MOVE) feel_location(x,y);
	if (Passes_walls && may_passwall(level, x,y)) {
	    ;	/* do nothing */
	} else if (tmpr->typ == IRONBARS) {
	    /* Eat the bars if you can. */
	    if ((mode == DO_MOVE && !flags.nopick &&
		 metallivorous(youmonst.data) && still_chewing(x, y)) ||
		!(Passes_walls || passes_bars(youmonst.data)))
		return FALSE;
	} else if (tunnels(youmonst.data) && !needspick(youmonst.data)) {
	    /* Eat the rock. */
	    if (mode == DO_MOVE && still_chewing(x,y)) return FALSE;
	} else if (flags.autodig && !flags.run && !flags.nopick &&
		   uwep && is_pick(uwep)) {
	    /* MRKR: Automatic digging when wielding the appropriate tool */
	    if (mode == DO_MOVE)
		use_pick_axe2(uwep, dx, dy, dz);
	    return FALSE;
	} else {
	    if (mode == DO_MOVE) {
		if (Is_stronghold(&u.uz) && is_db_wall(x,y))
		    pline("The drawbridge is up!");
		if (Passes_walls && !may_passwall(level, x,y) && In_sokoban(&u.uz))
		    pline("The Sokoban walls resist your ability.");
	    }
	    return FALSE;
	}
    } else if (IS_DOOR(tmpr->typ)) {
	if (closed_door(level, x,y)) {
	    if (Blind && mode == DO_MOVE) feel_location(x,y);
	    /* ALI - artifact doors */
	    if (artifact_door(level, x, y)) {
		if (mode == DO_MOVE) {
		    if (amorphous(youmonst.data)) {
			pline("You try to ooze under the door, "
			      "but the gap is too small.");
		    } else if (tunnels(youmonst.data) && !needspick(youmonst.data)) {
			pline("You hurt your teeth on the reinforced door.");
		    } else if (x == ux || y == uy) {
			if (Blind || Stunned || ACURR(A_DEX) < 10 || Fumbling) {
			    pline("Ouch!  You bump into a heavy door.");
			    exercise(A_DEX, FALSE);
			} else {
			    pline("That door is closed.");
			}
		    }
		}
		return FALSE;
	    } else if (Passes_walls)
		;	/* do nothing */
	    else if (can_ooze(&youmonst)) {
		if (mode == DO_MOVE) pline("You ooze under the door.");
	    } else if (tunnels(youmonst.data) && !needspick(youmonst.data)) {
		/* Eat the door. */
		if (mode == DO_MOVE && still_chewing(x,y)) return FALSE;
	    } else {
		if (mode == DO_MOVE) {
		    if (amorphous(youmonst.data))
			pline("You try to ooze under the door, but can't squeeze your possessions through.");
		    else if (x == ux || y == uy) {
			if (Blind || Stunned || ACURR(A_DEX) < 10 || Fumbling) {
			    if (u.usteed) {
				pline("You can't lead %s through that closed door.",
				         y_monnam(u.usteed));
			    } else {
			        pline("Ouch!  You bump into a door.");
			        exercise(A_DEX, FALSE);
			    }
			} else pline("That door is closed.");
		    }
		} else if (mode == TEST_TRAV || mode == TEST_TRAP) goto testdiag;
		return FALSE;
	    }
	} else {
	testdiag:
	    if (dx && dy && !Passes_walls
		&& ((tmpr->doormask & ~D_BROKEN)
		    || Is_rogue_level(&u.uz)
		    || block_door(x,y))) {
		/* Diagonal moves into a door are not allowed. */
		if (Blind && mode == DO_MOVE)
		    feel_location(x,y);
		return FALSE;
	    }
	}
    }
    if (dx && dy
	    && bad_rock(youmonst.data, TRUE, ux,y)
	    && bad_rock(youmonst.data, TRUE, x,uy)) {
	/* Move at a diagonal. */
	if (In_sokoban(&u.uz)) {
	    if (mode == DO_MOVE)
		pline("You cannot pass that way.");
	    return FALSE;
	}
	if (bigmonst(youmonst.data)) {
	    if (mode == DO_MOVE)
		pline("Your body is too large to fit through.");
	    return FALSE;
	}
	if (invent && (inv_weight() + weight_cap() > 600)) {
	    if (mode == DO_MOVE)
		pline("You are carrying too much to get through.");
	    return FALSE;
	}
    }
    /* Pick travel path that does not require crossing a trap.
     * Avoid water and lava using the usual running rules.
     * (but not u.ux/u.uy because findtravelpath walks toward u.ux/u.uy) */
    if (flags.run == 8 && (x != u.ux || y != u.uy)) {
	struct trap* t = t_at(level, x, y);

	if ((t && t->tseen) ||
	    (!Levitation && !Flying &&
	     !is_clinger(youmonst.data) &&
	     (is_pool(level, x, y) || is_lava(level, x, y) || is_swamp(level, x, y)) &&
	     level->locations[x][y].seenv)) {
	    if (mode == DO_MOVE) {
		if (is_pool(level, x, y)) autoexplore_msg("a body of water");
		else if (is_lava(level, x, y)) autoexplore_msg("a pool of lava");
		else if (is_swamp(level, x, y)) autoexplore_msg("a muddy swamp");
		if (flags.travel) return FALSE;
	    }
	    return mode == TEST_TRAP || mode == DO_MOVE;
	}
    }

    if (mode == TEST_TRAP) return FALSE; /* not a move through a trap */

    ust = &level->locations[ux][uy];

    /* Now see if other things block our way . . */
    if (dx && dy && !Passes_walls
		     && (IS_DOOR(ust->typ) && ((ust->doormask & ~D_BROKEN)
			     || Is_rogue_level(&u.uz)
			     || block_entry(x, y))
			 )) {
	/* Can't move at a diagonal out of a doorway with door. */
	if (mode == DO_MOVE)
	    autoexplore_msg("the doorway");
	return FALSE;
    }

    if (sobj_at(BOULDER, level, x, y) && (In_sokoban(&u.uz) || !Passes_walls)) {
	if (!(Blind || Hallucination) && (flags.run >= 2) && mode != TEST_TRAV) {
	    if (sobj_at(BOULDER, level, x, y) && mode == DO_MOVE)
		autoexplore_msg("a boulder");
	    return FALSE;
	}
	if (mode == DO_MOVE) {
	    /* tunneling monsters will chew before pushing */
	    if (tunnels(youmonst.data) && !needspick(youmonst.data) &&
		!In_sokoban(&u.uz)) {
		if (still_chewing(x,y)) return FALSE;
	    } else
		if (moverock(dx, dy) < 0) return FALSE;
	} else if (mode == TEST_TRAV) {
	    struct obj* obj;

	    /* never travel through boulders in Sokoban */
	    if (In_sokoban(&u.uz)) return FALSE;

	    /* don't pick two boulders in a row, unless there's a way thru */
	    if (sobj_at(BOULDER, level, ux,uy) && !In_sokoban(&u.uz)) {
		if (!Passes_walls &&
		    !(tunnels(youmonst.data) && !needspick(youmonst.data)) &&
		    !carrying(PICK_AXE) && !carrying(DWARVISH_MATTOCK) &&
		    !((obj = carrying(WAN_DIGGING)) &&
		      !objects[obj->otyp].oc_name_known))
		    return FALSE;
	    }
	}
	/* assume you'll be able to push it when you get there... */
    }

    /* OK, it is a legal place to move. */
    return TRUE;
}